

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::checkRemoveCommandBufferInfo(CLIntercept *this,cl_command_buffer_khr cmdbuf)

{
  mutex *__mutex;
  _Rb_tree_header *p_Var1;
  int iVar2;
  cl_int cVar3;
  iterator __position;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  undefined8 uVar7;
  _Base_ptr p_Var8;
  iterator __position_00;
  _Base_ptr p_Var9;
  pair<std::_Rb_tree_iterator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>,_std::_Rb_tree_iterator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
  pVar10;
  pair<std::_Rb_tree_iterator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>,_std::_Rb_tree_iterator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
  pVar11;
  cl_uint refCount;
  _cl_mutable_command_khr *cmd;
  int local_5c;
  cl_command_buffer_khr local_58;
  string local_50;
  
  __mutex = &this->m_Mutex;
  local_58 = cmdbuf;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    uVar7 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar7);
  }
  p_Var6 = (this->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var6 == (_Base_ptr)0x0) goto LAB_0017bb73;
  p_Var1 = &(this->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header;
  __position._M_node = &p_Var1->_M_header;
  do {
    if (*(cl_command_buffer_khr *)(p_Var6 + 1) >= cmdbuf) {
      __position._M_node = p_Var6;
    }
    p_Var6 = (&p_Var6->_M_left)[*(cl_command_buffer_khr *)(p_Var6 + 1) < cmdbuf];
  } while (p_Var6 != (_Base_ptr)0x0);
  if (((_Rb_tree_header *)__position._M_node == p_Var1) ||
     (cmdbuf < *(cl_command_buffer_khr *)(__position._M_node + 1))) goto LAB_0017bb73;
  p_Var9 = __position._M_node[1]._M_parent;
  p_Var8 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = &p_Var1->_M_header;
  if (p_Var8 == (_Base_ptr)0x0) {
LAB_0017b9a0:
    local_50._M_dataplus._M_p = (pointer)0x0;
    pmVar4 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)&local_50);
  }
  else {
    do {
      if (*(_Base_ptr *)(p_Var8 + 1) >= p_Var9) {
        p_Var5 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[*(_Base_ptr *)(p_Var8 + 1) < p_Var9];
    } while (p_Var8 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 == p_Var1) || (p_Var9 < *(_Base_ptr *)(p_Var5 + 1)))
    goto LAB_0017b9a0;
    pmVar4 = (mapped_type *)&p_Var5[1]._M_parent;
  }
  if (pmVar4->clGetCommandBufferInfoKHR ==
      (_func_cl_int_cl_command_buffer_khr_cl_command_buffer_info_khr_size_t_void_ptr_size_t_ptr *)
      0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"clGetCommandBufferInfoKHR","");
    getExtensionFunctionAddress(this,(cl_platform_id)p_Var9,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  p_Var8 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  if (p_Var8 == (_Base_ptr)0x0) {
LAB_0017ba55:
    local_50._M_dataplus._M_p = (pointer)0x0;
    pmVar4 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)&local_50);
  }
  else {
    do {
      if (*(_Base_ptr *)(p_Var8 + 1) >= p_Var9) {
        p_Var5 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[*(_Base_ptr *)(p_Var8 + 1) < p_Var9];
    } while (p_Var8 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 == p_Var1) ||
       (p_Var9 < (_Base_ptr)((_Rb_tree_header *)p_Var5)->_M_node_count)) goto LAB_0017ba55;
    pmVar4 = (mapped_type *)((long)p_Var5 + 0x28);
  }
  if (pmVar4->clGetCommandBufferInfoKHR !=
      (_func_cl_int_cl_command_buffer_khr_cl_command_buffer_info_khr_size_t_void_ptr_size_t_ptr *)
      0x0) {
    local_5c = 0;
    cVar3 = (*pmVar4->clGetCommandBufferInfoKHR)(cmdbuf,0x1296,4,&local_5c,(size_t *)0x0);
    if ((cVar3 == 0) && (local_5c == 1)) {
      std::
      _Rb_tree<_cl_command_buffer_khr*,std::pair<_cl_command_buffer_khr*const,_cl_platform_id*>,std::_Select1st<std::pair<_cl_command_buffer_khr*const,_cl_platform_id*>>,std::less<_cl_command_buffer_khr*>,std::allocator<std::pair<_cl_command_buffer_khr*const,_cl_platform_id*>>>
      ::erase_abi_cxx11_((_Rb_tree<_cl_command_buffer_khr*,std::pair<_cl_command_buffer_khr*const,_cl_platform_id*>,std::_Select1st<std::pair<_cl_command_buffer_khr*const,_cl_platform_id*>>,std::less<_cl_command_buffer_khr*>,std::allocator<std::pair<_cl_command_buffer_khr*const,_cl_platform_id*>>>
                          *)&this->m_CommandBufferInfoMap,__position);
      pVar10 = std::
               _Rb_tree<_cl_command_buffer_khr_*,_std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>,_std::_Select1st<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
               ::equal_range(&(this->m_CommandBufferRecordMap)._M_t,&local_58);
      std::
      _Rb_tree<_cl_command_buffer_khr_*,_std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>,_std::_Select1st<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
      ::_M_erase_aux(&(this->m_CommandBufferRecordMap)._M_t,(_Base_ptr)pVar10.first._M_node,
                     (_Base_ptr)pVar10.second._M_node);
      p_Var6 = (this->m_CommandBufferMutableCommandsMap)._M_t._M_impl.super__Rb_tree_header.
               _M_header._M_parent;
      if (p_Var6 != (_Base_ptr)0x0) {
        p_Var1 = &(this->m_CommandBufferMutableCommandsMap)._M_t._M_impl.super__Rb_tree_header;
        __position_00._M_node = &p_Var1->_M_header;
        do {
          if (*(cl_command_buffer_khr *)(p_Var6 + 1) >= local_58) {
            __position_00._M_node = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[*(cl_command_buffer_khr *)(p_Var6 + 1) < local_58];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)__position_00._M_node != p_Var1) &&
           (*(cl_command_buffer_khr *)(__position_00._M_node + 1) <= local_58)) {
          p_Var9 = __position_00._M_node[1]._M_parent;
          if (p_Var9 != (_Base_ptr)&__position_00._M_node[1]._M_parent) {
            do {
              local_50._M_dataplus._M_p = (pointer)p_Var9->_M_left;
              pVar11 = std::
                       _Rb_tree<_cl_mutable_command_khr_*,_std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>,_std::_Select1st<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
                       ::equal_range(&(this->m_MutableCommandInfoMap)._M_t,(key_type *)&local_50);
              std::
              _Rb_tree<_cl_mutable_command_khr_*,_std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>,_std::_Select1st<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
              ::_M_erase_aux(&(this->m_MutableCommandInfoMap)._M_t,(_Base_ptr)pVar11.first._M_node,
                             (_Base_ptr)pVar11.second._M_node);
              p_Var9 = *(_Base_ptr *)p_Var9;
            } while (p_Var9 != (_Base_ptr)&__position_00._M_node[1]._M_parent);
          }
          std::
          _Rb_tree<_cl_command_buffer_khr*,std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>,std::_Select1st<std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>>,std::less<_cl_command_buffer_khr*>,std::allocator<std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>>>
          ::erase_abi_cxx11_((_Rb_tree<_cl_command_buffer_khr*,std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>,std::_Select1st<std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>>,std::less<_cl_command_buffer_khr*>,std::allocator<std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>>>
                              *)&this->m_CommandBufferMutableCommandsMap,__position_00);
        }
      }
    }
  }
LAB_0017bb73:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void CLIntercept::checkRemoveCommandBufferInfo(
    cl_command_buffer_khr cmdbuf)
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CCommandBufferInfoMap::iterator iter = m_CommandBufferInfoMap.find( cmdbuf );
    if( iter != m_CommandBufferInfoMap.end() )
    {
        cl_platform_id  platform = iter->second;
        if( dispatchX(platform).clGetCommandBufferInfoKHR == NULL )
        {
            getExtensionFunctionAddress(
                platform,
                "clGetCommandBufferInfoKHR" );
        }

        const auto& dispatchX = this->dispatchX(platform);
        if( dispatchX.clGetCommandBufferInfoKHR )
        {
            cl_uint refCount = 0;
            cl_int  errorCode = CL_SUCCESS;
            errorCode = dispatchX.clGetCommandBufferInfoKHR(
                cmdbuf,
                CL_COMMAND_BUFFER_REFERENCE_COUNT_KHR,
                sizeof( refCount ),
                &refCount,
                NULL );
            if( errorCode == CL_SUCCESS && refCount == 1 )
            {
                m_CommandBufferInfoMap.erase( iter );
                m_CommandBufferRecordMap.erase( cmdbuf );

                CCommandBufferMutableCommandsMap::iterator cmditer =
                    m_CommandBufferMutableCommandsMap.find( cmdbuf );
                if( cmditer != m_CommandBufferMutableCommandsMap.end() )
                {
                    CMutableCommandList&    cmdList = cmditer->second;
                    for( auto cmd : cmdList )
                    {
                        m_MutableCommandInfoMap.erase(cmd);
                    }

                    m_CommandBufferMutableCommandsMap.erase(cmditer);
                }
            }
        }
    }
}